

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.hpp
# Opt level: O0

intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>,_std::less<void>_>
* __thiscall
burst::
make_intersect_iterator<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>const,std::forward_list<int,std::allocator<int>>const>
          (intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,
          tuple<const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::forward_list<int,_std::allocator<int>_>_&>
          *ranges)

{
  tuple<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>
  *in_RCX;
  iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>_>
  *ranges_00;
  vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>
  local_e0;
  iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>_>
  local_c8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined1 local_78 [8];
  tuple<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>
  common_ranges;
  tuple<const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&,_const_std::forward_list<int,_std::allocator<int>_>_&>
  *ranges_local;
  
  local_88 = *(undefined8 *)(this + 0x10);
  local_98 = *(undefined8 *)this;
  uStack_90 = *(undefined8 *)(this + 8);
  common_ranges.
  super__Tuple_impl<0UL,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>
  .
  super__Head_base<0UL,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_false>
  ._M_head_impl.
  super_iterator_range_base<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End.m_iterator.storage_.super_aligned_storage_imp<8UL,_8UL>.data_ =
       (aligned_storage_imp<8UL,_8UL>)(aligned_storage_imp<8UL,_8UL>)this;
  detail::
  uniform_range_tuple_please<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>const,std::forward_list<int,std::allocator<int>>const>
            ((tuple<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>
              *)local_78,(detail *)&local_98,ranges);
  apply<burst::make_range_vector_t_const&,std::tuple<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Fwd_list_const_iterator<int>>>,boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Fwd_list_const_iterator<int>>>,boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Fwd_list_const_iterator<int>>>>&>
            (&local_e0,(burst *)&make_range_vector,(make_range_vector_t *)local_78,in_RCX);
  own_as_range_t::operator()(&local_c8,(own_as_range_t *)&own_as_range,&local_e0);
  make_intersect_iterator<boost::iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Fwd_list_const_iterator<int>>>,std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Fwd_list_const_iterator<int>>>>>>>>
            (__return_storage_ptr__,(burst *)&local_c8,ranges_00);
  boost::
  iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>_>
  ::~iterator_range(&local_c8);
  std::
  vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>
  ::~vector(&local_e0);
  std::
  tuple<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>
  ::~tuple((tuple<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>
            *)local_78);
  return __return_storage_ptr__;
}

Assistant:

auto make_intersect_iterator (std::tuple<Ranges &...> ranges)
    {
        auto common_ranges = detail::uniform_range_tuple_please(ranges);
        return
            make_intersect_iterator
            (
                burst::own_as_range(burst::apply(burst::make_range_vector, common_ranges))
            );
    }